

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall Pathie::ErrnoError::ErrnoError(ErrnoError *this,int val)

{
  char *__rhs;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  PathieError::PathieError(&this->super_PathieError);
  *(undefined ***)&this->super_PathieError = &PTR__GlobError_00114bf8;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,val);
  this->m_val = val;
  std::__cxx11::stringbuf::str();
  std::operator+(&local_200,"Errno ",&local_220);
  std::operator+(&local_1e0,&local_200,": ");
  __rhs = strerror(val);
  std::operator+(&local_1c0,&local_1e0,__rhs);
  std::__cxx11::string::_M_assign((string *)&(this->super_PathieError).m_pathie_errmsg);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

ErrnoError::ErrnoError(int val)
{
  std::stringstream ss;
  ss << val;

  m_val = val;
  m_pathie_errmsg = "Errno " + ss.str() + ": " + strerror(val);
}